

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult GenValidUsageNextXrDestroyDebugUtilsMessengerEXT(XrDebugUtilsMessengerEXT messenger)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrDebugUtilsMessengerEXT_T_*>::getWithInstanceInfo
                    (&g_debugutilsmessengerext_info,messenger);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyDebugUtilsMessengerEXT)(messenger);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrDebugUtilsMessengerEXT_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_debugutilsmessengerext_info.
                super_HandleInfoBase<XrDebugUtilsMessengerEXT_T_*,_GenValidUsageXrHandleInfo>,
               messenger);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyDebugUtilsMessengerEXT(
    XrDebugUtilsMessengerEXT messenger) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_debugutilsmessengerext_info.getWithInstanceInfo(messenger);
        GenValidUsageXrHandleInfo *gen_debugutilsmessengerext_info = info_with_instance.first;
        (void)gen_debugutilsmessengerext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyDebugUtilsMessengerEXT(messenger);
        if (XR_SUCCEEDED(result)) {
            g_debugutilsmessengerext_info.erase(messenger);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}